

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O2

void __thiscall
OpenMPVariantClause::generateDOT
          (OpenMPVariantClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  OpenMPClauseKind OVar1;
  OpenMPDirective *pOVar2;
  bool bVar3;
  reference pvVar4;
  bool bVar5;
  uint index_00;
  ulong __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  OpenMPVariantClause *local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string node_id;
  string indent;
  string current_line;
  string clause_string;
  string parameter_string;
  string clause_type;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  parameter_string._M_dataplus._M_p = (pointer)&parameter_string.field_2;
  parameter_string._M_string_length = 0;
  parameter_string.field_2._M_local_buf[0] = '\0';
  current_line._M_dataplus._M_p = (pointer)&current_line.field_2;
  current_line._M_string_length = 0;
  current_line.field_2._M_local_buf[0] = '\0';
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  local_1e8 = this;
  std::__cxx11::string::_M_construct((ulong)&indent,(char)depth);
  clause_string._M_dataplus._M_p = (pointer)&clause_string.field_2;
  clause_string._M_string_length = 0;
  clause_type._M_dataplus._M_p = (pointer)&clause_type.field_2;
  clause_type._M_string_length = 0;
  clause_string.field_2._M_local_buf[0] = '\0';
  clause_type.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::substr((ulong)&node_id,(ulong)parent_node);
  std::__cxx11::string::operator=((string *)parent_node,(string *)&node_id);
  std::__cxx11::string::~string((string *)&node_id);
  OVar1 = (local_1e8->super_OpenMPClause).kind;
  if ((OVar1 == OMPC_when) || (OVar1 == OMPC_match)) {
    std::__cxx11::string::assign((char *)&clause_type);
  }
  else {
    std::operator<<((ostream *)&std::cout,"The variant clause is not supported.\n");
  }
  std::operator+(&local_1e0,parent_node,"_");
  std::operator+(&local_228,&local_1e0,&clause_type);
  std::operator+(&local_268,&local_228,"_");
  std::__cxx11::to_string(&local_90,depth);
  std::operator+(&local_248,&local_268,&local_90);
  std::operator+(&local_208,&local_248,"_");
  std::__cxx11::to_string(&local_b0,index);
  std::operator+(&node_id,&local_208,&local_b0);
  std::__cxx11::string::operator=((string *)&clause_string,(string *)&node_id);
  std::__cxx11::string::~string((string *)&node_id);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::operator+(&local_268,&indent,parent_node);
  std::operator+(&local_248,&local_268," -- ");
  std::operator+(&local_208,&local_248,&clause_string);
  std::operator+(&node_id,&local_208,"\n");
  std::__cxx11::string::operator=((string *)&current_line,(string *)&node_id);
  std::__cxx11::string::~string((string *)&node_id);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&indent);
  std::operator+(&local_268,&indent,&clause_string);
  std::operator+(&local_248,&local_268," [label = \"");
  std::operator+(&local_208,&local_248,&clause_type);
  std::operator+(&node_id,&local_208,"\"]\n");
  std::__cxx11::string::operator=((string *)&current_line,(string *)&node_id);
  std::__cxx11::string::~string((string *)&node_id);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&node_id,"",(allocator<char> *)&local_208);
  if ((local_1e8->user_condition_expression).second._M_string_length != 0) {
    std::operator+(&local_208,&clause_string,"_user_condition");
    std::__cxx11::string::operator=((string *)&node_id,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::operator+(&local_228,&indent,&clause_string);
    std::operator+(&local_268,&local_228," -- ");
    std::operator+(&local_248,&local_268,&node_id);
    std::operator+(&local_208,&local_248,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_268,&indent,"\t");
    std::operator+(&local_248,&local_268,&node_id);
    std::operator+(&local_208,&local_248," [label = \"user_condition\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    if ((local_1e8->user_condition_expression).first._M_string_length != 0) {
      std::operator+(&local_1e0,&indent,"\t");
      std::operator+(&local_228,&local_1e0,&node_id);
      std::operator+(&local_268,&local_228," -- ");
      std::operator+(&local_248,&local_268,&node_id);
      std::operator+(&local_208,&local_248,"_score\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
      std::operator+(&local_1e0,&indent,"\t\t");
      std::operator+(&local_228,&local_1e0,&node_id);
      std::operator+(&local_268,&local_228,"_score [label = \"score\\n ");
      std::operator+(&local_248,&local_268,&(local_1e8->user_condition_expression).first);
      std::operator+(&local_208,&local_248,"\"]\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    }
    std::operator+(&local_1e0,&indent,"\t");
    std::operator+(&local_228,&local_1e0,&node_id);
    std::operator+(&local_268,&local_228," -- ");
    std::operator+(&local_248,&local_268,&node_id);
    std::operator+(&local_208,&local_248,"_expr\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_1e0,&indent,"\t\t");
    std::operator+(&local_228,&local_1e0,&node_id);
    std::operator+(&local_268,&local_228,"_expr [label = \"expr\\n ");
    std::operator+(&local_248,&local_268,&(local_1e8->user_condition_expression).second);
    std::operator+(&local_208,&local_248,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
  }
  if ((local_1e8->construct_directives).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (local_1e8->construct_directives).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::operator+(&local_208,&clause_string,"_construct");
    std::__cxx11::string::operator=((string *)&node_id,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::operator+(&local_228,&indent,&clause_string);
    std::operator+(&local_268,&local_228," -- ");
    std::operator+(&local_248,&local_268,&node_id);
    std::operator+(&local_208,&local_248,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_268,&indent,"\t");
    std::operator+(&local_248,&local_268,&node_id);
    std::operator+(&local_208,&local_248," [label = \"construct\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    this_00 = &local_1e8->construct_directives;
    for (index_00 = 0; __n = (ulong)index_00,
        __n < (ulong)(((long)(local_1e8->construct_directives).
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_1e8->construct_directives).
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x28);
        index_00 = index_00 + 1) {
      pvVar4 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
               ::at(this_00,__n);
      pOVar2 = pvVar4->second;
      std::__cxx11::string::string((string *)&local_50,(string *)&node_id);
      pvVar4 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
               ::at(this_00,__n);
      std::__cxx11::string::string((string *)&local_70,(string *)pvVar4);
      OpenMPDirective::generateDOT(pOVar2,dot_file,depth + 2,index_00,&local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  if ((local_1e8->arch_expression).second._M_string_length == 0) {
    bVar5 = false;
  }
  else {
    std::operator+(&local_208,&clause_string,"_device");
    std::__cxx11::string::operator=((string *)&node_id,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::operator+(&local_228,&indent,&clause_string);
    std::operator+(&local_268,&local_228," -- ");
    std::operator+(&local_248,&local_268,&node_id);
    std::operator+(&local_208,&local_248,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_268,&indent,"\t");
    std::operator+(&local_248,&local_268,&node_id);
    std::operator+(&local_208,&local_248," [label = \"device\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_1e0,&indent,"\t");
    std::operator+(&local_228,&local_1e0,&node_id);
    std::operator+(&local_268,&local_228," -- ");
    std::operator+(&local_248,&local_268,&node_id);
    std::operator+(&local_208,&local_248,"_arch\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_268,&indent,"\t\t");
    std::operator+(&local_248,&local_268,&node_id);
    std::operator+(&local_208,&local_248,"_arch [label = \"arch\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    if ((local_1e8->arch_expression).first._M_string_length != 0) {
      std::operator+(&local_1e0,&indent,"\t\t");
      std::operator+(&local_228,&local_1e0,&node_id);
      std::operator+(&local_268,&local_228,"_arch -- ");
      std::operator+(&local_248,&local_268,&node_id);
      std::operator+(&local_208,&local_248,"_arch_score\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
      std::operator+(&local_1e0,&indent,"\t\t\t");
      std::operator+(&local_228,&local_1e0,&node_id);
      std::operator+(&local_268,&local_228,"_arch_score [label = \"score\\n ");
      std::operator+(&local_248,&local_268,&(local_1e8->arch_expression).first);
      std::operator+(&local_208,&local_248,"\"]\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    }
    std::operator+(&local_1e0,&indent,"\t\t");
    std::operator+(&local_228,&local_1e0,&node_id);
    std::operator+(&local_268,&local_228,"_arch -- ");
    std::operator+(&local_248,&local_268,&node_id);
    std::operator+(&local_208,&local_248,"_arch_expr\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_1e0,&indent,"\t\t\t");
    std::operator+(&local_228,&local_1e0,&node_id);
    std::operator+(&local_268,&local_228,"_arch_expr [label = \"expr\\n ");
    std::operator+(&local_248,&local_268,&(local_1e8->arch_expression).second);
    std::operator+(&local_208,&local_248,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_1e0);
    bVar5 = true;
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
  }
  __lhs = &(local_1e8->isa_expression).second;
  bVar3 = std::operator!=(__lhs,"");
  if (bVar3) {
    if (!bVar5) {
      std::operator+(&local_208,&clause_string,"_device");
      std::__cxx11::string::operator=((string *)&node_id,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::operator+(&local_228,&indent,&clause_string);
      std::operator+(&local_268,&local_228," -- ");
      std::operator+(&local_248,&local_268,&node_id);
      std::operator+(&local_208,&local_248,"\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_228);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
      std::operator+(&local_268,&indent,"\t");
      std::operator+(&local_248,&local_268,&node_id);
      std::operator+(&local_208,&local_248," [label = \"device\"]\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      bVar5 = true;
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    }
    std::operator+(&local_1e0,&indent,"\t");
    std::operator+(&local_228,&local_1e0,&node_id);
    std::operator+(&local_268,&local_228," -- ");
    std::operator+(&local_248,&local_268,&node_id);
    std::operator+(&local_208,&local_248,"_isa\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_268,&indent,"\t\t");
    std::operator+(&local_248,&local_268,&node_id);
    std::operator+(&local_208,&local_248,"_isa [label = \"isa\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    if ((local_1e8->isa_expression).first._M_string_length != 0) {
      std::operator+(&local_1e0,&indent,"\t\t");
      std::operator+(&local_228,&local_1e0,&node_id);
      std::operator+(&local_268,&local_228,"_isa -- ");
      std::operator+(&local_248,&local_268,&node_id);
      std::operator+(&local_208,&local_248,"_isa_score\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
      std::operator+(&local_1e0,&indent,"\t\t\t");
      std::operator+(&local_228,&local_1e0,&node_id);
      std::operator+(&local_268,&local_228,"_isa_score [label = \"score\\n ");
      std::operator+(&local_248,&local_268,&(local_1e8->isa_expression).first);
      std::operator+(&local_208,&local_248,"\"]\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    }
    std::operator+(&local_1e0,&indent,"\t\t");
    std::operator+(&local_228,&local_1e0,&node_id);
    std::operator+(&local_268,&local_228,"_isa -- ");
    std::operator+(&local_248,&local_268,&node_id);
    std::operator+(&local_208,&local_248,"_isa_expr\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_1e0,&indent,"\t\t\t");
    std::operator+(&local_228,&local_1e0,&node_id);
    std::operator+(&local_268,&local_228,"_isa_expr [label = \"expr\\n ");
    std::operator+(&local_248,&local_268,__lhs);
    std::operator+(&local_208,&local_248,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
  }
  parameter_string._M_string_length = 0;
  *parameter_string._M_dataplus._M_p = '\0';
  switch((local_1e8->context_kind_name).second) {
  case OMPC_CONTEXT_KIND_host:
    break;
  case OMPC_CONTEXT_KIND_nohost:
    break;
  case OMPC_CONTEXT_KIND_any:
    break;
  case OMPC_CONTEXT_KIND_cpu:
    break;
  case OMPC_CONTEXT_KIND_gpu:
    break;
  case OMPC_CONTEXT_KIND_fpga:
    break;
  case OMPC_CONTEXT_KIND_unknown:
    goto switchD_00154e92_caseD_6;
  default:
    std::operator<<((ostream *)&std::cout,"The context kind is not supported.\n");
    goto switchD_00154e92_caseD_6;
  }
  std::__cxx11::string::assign((char *)&parameter_string);
switchD_00154e92_caseD_6:
  if (parameter_string._M_string_length != 0) {
    if (!bVar5) {
      std::operator+(&local_208,&clause_string,"_device");
      std::__cxx11::string::operator=((string *)&node_id,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::operator+(&local_228,&indent,&clause_string);
      std::operator+(&local_268,&local_228," -- ");
      std::operator+(&local_248,&local_268,&node_id);
      std::operator+(&local_208,&local_248,"\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_228);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
      std::operator+(&local_268,&indent,"\t");
      std::operator+(&local_248,&local_268,&node_id);
      std::operator+(&local_208,&local_248," [label = \"device\"]\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    }
    std::operator+(&local_1e0,&indent,"\t");
    std::operator+(&local_228,&local_1e0,&node_id);
    std::operator+(&local_268,&local_228," -- ");
    std::operator+(&local_248,&local_268,&node_id);
    std::operator+(&local_208,&local_248,"_kind\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_268,&indent,"\t\t");
    std::operator+(&local_248,&local_268,&node_id);
    std::operator+(&local_208,&local_248,"_kind [label = \"kind\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    if ((local_1e8->context_kind_name).first._M_string_length != 0) {
      std::operator+(&local_1e0,&indent,"\t\t");
      std::operator+(&local_228,&local_1e0,&node_id);
      std::operator+(&local_268,&local_228,"_kind -- ");
      std::operator+(&local_248,&local_268,&node_id);
      std::operator+(&local_208,&local_248,"_kind_score\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
      std::operator+(&local_1e0,&indent,"\t\t\t");
      std::operator+(&local_228,&local_1e0,&node_id);
      std::operator+(&local_268,&local_228,"_kind_score [label = \"score\\n ");
      std::operator+(&local_248,&local_268,&(local_1e8->context_kind_name).first);
      std::operator+(&local_208,&local_248,"\"]\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    }
    std::operator+(&local_1e0,&indent,"\t\t");
    std::operator+(&local_228,&local_1e0,&node_id);
    std::operator+(&local_268,&local_228,"_kind -- ");
    std::operator+(&local_248,&local_268,&node_id);
    std::operator+(&local_208,&local_248,"_kind_value\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
    std::operator+(&local_1e0,&indent,"\t\t\t");
    std::operator+(&local_228,&local_1e0,&node_id);
    std::operator+(&local_268,&local_228,"_kind_value [label = \"");
    std::operator+(&local_248,&local_268,&parameter_string);
    std::operator+(&local_208,&local_248,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
  }
  if ((OVar1 == OMPC_when) &&
     (pOVar2 = (OpenMPDirective *)local_1e8[1].super_OpenMPClause._vptr_OpenMPClause,
     pOVar2 != (OpenMPDirective *)0x0)) {
    std::__cxx11::string::string((string *)&local_d0,(string *)&clause_string);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"",(allocator<char> *)&local_208);
    OpenMPDirective::generateDOT(pOVar2,dot_file,depth + 1,0,&local_d0,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::__cxx11::string::~string((string *)&node_id);
  std::__cxx11::string::~string((string *)&clause_type);
  std::__cxx11::string::~string((string *)&clause_string);
  std::__cxx11::string::~string((string *)&indent);
  std::__cxx11::string::~string((string *)&current_line);
  std::__cxx11::string::~string((string *)&parameter_string);
  return;
}

Assistant:

void OpenMPVariantClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string parameter_string;
    std::pair<std::string, std::string>* parameter_pair_string;
    std::vector<std::pair<std::string, OpenMPDirective*> >* parameter_pair_directives;
    OpenMPDirective* variant_directive = NULL;

/*

    // check implementation
    clause_string.clear();
    parameter_string.clear();
    // check implementation vendor
    OpenMPClauseContextVendor context_vendor = this->getImplementationKind();
    switch (context_vendor) {
        case OMPC_CONTEXT_VENDOR_amd:
            parameter_string = "amd";
            break;
        case OMPC_CONTEXT_VENDOR_arm:
            parameter_string = "arm";
            break;
        case OMPC_CONTEXT_VENDOR_bsc:
            parameter_string = "bsc";
            break;
        case OMPC_CONTEXT_VENDOR_cray:
            parameter_string = "cray";
            break;
        case OMPC_CONTEXT_VENDOR_fujitsu:
            parameter_string = "fujitsu";
            break;
        case OMPC_CONTEXT_VENDOR_gnu:
            parameter_string = "gnu";
            break;
        case OMPC_CONTEXT_VENDOR_ibm:
            parameter_string = "ibm";
            break;
        case OMPC_CONTEXT_VENDOR_intel:
            parameter_string = "intel";
            break;
        case OMPC_CONTEXT_VENDOR_llvm:
            parameter_string = "llvm";
            break;
        case OMPC_CONTEXT_VENDOR_pgi:
            parameter_string = "pgi";
            break;
        case OMPC_CONTEXT_VENDOR_ti:
            parameter_string = "ti";
            break;
        case OMPC_CONTEXT_VENDOR_unknown:
            parameter_string = "unknown";
            break;
        case OMPC_CONTEXT_VENDOR_unspecified:
            break;
        default:
            std::cout << "The context vendor is not supported.\n";
    };
    if (parameter_string.size() > 0) {
        clause_string += "vendor(" + parameter_string + "), ";
    };

    // check implementation extension
    parameter_string = this->getExtensionExpression();
    if (parameter_string.size() > 0) {
        clause_string += "extension(" + parameter_string + "), ";
    };

    if (clause_string.size() > 0) {
        result += "implementation = {" + clause_string.substr(0, clause_string.size()-2) + "}, ";
    };

    clause_string.clear();
    result = result.substr(0, result.size()-2);



    result += clause_string + ") ";

    //return result;*/
    std::string current_line;
    std::string indent = std::string(depth, '\t');
    std::string clause_string;
    std::string clause_type;
    //std::vector<OpenMPDirective*>* parameter_directives;
    parent_node = parent_node.substr(0, parent_node.size()-1);
    OpenMPClauseKind clause_kind = this->getKind();
    switch (clause_kind) {
        case OMPC_when:
            clause_type = "when";
            break;
        case OMPC_match:
            clause_type = "match";
            break;
        default:
            std::cout << "The variant clause is not supported.\n";
    };
    clause_string = parent_node + "_" + clause_type + "_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + " -- " + clause_string + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    current_line = indent + clause_string + " [label = \"" + clause_type + "\"]\n";
    dot_file << current_line.c_str();

    std::string node_id = "";
    // check user
    parameter_pair_string = this->getUserCondition();
    if (parameter_pair_string->second.size() > 0) {
        node_id = clause_string + "_user_condition";
        current_line = indent + clause_string + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"user_condition\"]\n";
        dot_file << current_line.c_str();
        // output score
        if (parameter_pair_string->first.size() > 0) {
            current_line = indent + "\t" + node_id + " -- " + node_id + "_score\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t\t" + node_id + "_score [label = \"score\\n " + parameter_pair_string->first + "\"]\n";
            dot_file << current_line.c_str();
        };
        // output condition expression
        current_line = indent + "\t" + node_id + " -- " + node_id + "_expr\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t" + node_id + "_expr [label = \"expr\\n " + parameter_pair_string->second + "\"]\n";
        dot_file << current_line.c_str();
    };

    // check construct
    parameter_pair_directives = this->getConstructDirective();
    if (parameter_pair_directives->size() != 0) {
        node_id = clause_string + "_construct";
        current_line = indent + clause_string + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"construct\"]\n";
        dot_file << current_line.c_str();
        for (unsigned int i = 0; i < parameter_pair_directives->size(); i++) {
            parameter_pair_directives->at(i).second->generateDOT(dot_file, depth+2, i, node_id, parameter_pair_directives->at(i).first);
        };
    };

    // check device_arch
    bool has_device = false;
    parameter_pair_string = this->getArchExpression();
    if (parameter_pair_string->second.size() > 0) {
        if (!has_device) {
            node_id = clause_string + "_device";
            current_line = indent + clause_string + " -- " + node_id + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"device\"]\n";
            dot_file << current_line.c_str();
            has_device = true;
        };
        current_line = indent + "\t" + node_id + " -- " + node_id + "_arch\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t" + node_id + "_arch [label = \"arch\"]\n";
        dot_file << current_line.c_str();
        // output score
        if (parameter_pair_string->first.size() > 0 ) {
            current_line = indent + "\t\t" + node_id + "_arch -- " + node_id + "_arch_score\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t\t\t" + node_id + "_arch_score [label = \"score\\n " + parameter_pair_string->first + "\"]\n";
            dot_file << current_line.c_str();
        };
        // output arch expression
        current_line = indent + "\t\t" + node_id + "_arch -- " + node_id + "_arch_expr\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t\t" + node_id + "_arch_expr [label = \"expr\\n " + parameter_pair_string->second + "\"]\n";
        dot_file << current_line.c_str();
    };

    // check device_isa
    parameter_pair_string = this->getIsaExpression();
    if (parameter_pair_string->second != "") {
        if (!has_device) {
            node_id = clause_string + "_device";
            current_line = indent + clause_string + " -- " + node_id + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"device\"]\n";
            dot_file << current_line.c_str();
            has_device = true;
        };
        current_line = indent + "\t" + node_id + " -- " + node_id + "_isa\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t" + node_id + "_isa [label = \"isa\"]\n";
        dot_file << current_line.c_str();
        // output score
        if (parameter_pair_string->first.size() > 0) {
            current_line = indent + "\t\t" + node_id + "_isa -- " + node_id + "_isa_score\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t\t\t" + node_id + "_isa_score [label = \"score\\n " + parameter_pair_string->first + "\"]\n";
            dot_file << current_line.c_str();
        };
        // output isa expression
        current_line = indent + "\t\t" + node_id + "_isa -- " + node_id + "_isa_expr\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t\t" + node_id + "_isa_expr [label = \"expr\\n " + parameter_pair_string->second + "\"]\n";
        dot_file << current_line.c_str();
    };

    // check device_kind
    parameter_string.clear();
    std::pair<std::string, OpenMPClauseContextKind>* context_kind = this->getContextKind();
    switch (context_kind->second) {
        case OMPC_CONTEXT_KIND_host:
            parameter_string = "host";
            break;
        case OMPC_CONTEXT_KIND_nohost:
            parameter_string = "nohost";
            break;
        case OMPC_CONTEXT_KIND_any:
            parameter_string = "any";
            break;
        case OMPC_CONTEXT_KIND_cpu:
            parameter_string = "cpu";
            break;
        case OMPC_CONTEXT_KIND_gpu:
            parameter_string = "gpu";
            break;
        case OMPC_CONTEXT_KIND_fpga:
            parameter_string = "fpga";
            break;
        case OMPC_CONTEXT_KIND_unknown:
            break;
        default:
            std::cout << "The context kind is not supported.\n";
    };

    if (parameter_string.size() > 0) {
        if (!has_device) {
            node_id = clause_string + "_device";
            current_line = indent + clause_string + " -- " + node_id + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"device\"]\n";
            dot_file << current_line.c_str();
            has_device = true;
        };
        current_line = indent + "\t" + node_id + " -- " + node_id + "_kind\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t" + node_id + "_kind [label = \"kind\"]\n";
        dot_file << current_line.c_str();
        // output score
        if (context_kind->first.size() > 0) {
            current_line = indent + "\t\t" + node_id + "_kind -- " + node_id + "_kind_score\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t\t\t" + node_id + "_kind_score [label = \"score\\n " + context_kind->first + "\"]\n";
            dot_file << current_line.c_str();
        };
        // output kind value
        current_line = indent + "\t\t" + node_id + "_kind -- " + node_id + "_kind_value\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t\t" + node_id + "_kind_value [label = \"" + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };

    if (clause_kind == OMPC_when) {
        variant_directive = ((OpenMPWhenClause*)this)->getVariantDirective();
        if (variant_directive != NULL) {
            variant_directive->generateDOT(dot_file, depth+1, 0, clause_string, "");
        };
    };
}